

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

PointerReader *
capnp::_::PointerReader::getRoot
          (PointerReader *__return_storage_ptr__,SegmentReader *segment,CapTableReader *capTable,
          word *location,int nestingLimit)

{
  bool bVar1;
  Fault local_30;
  Fault f;
  int nestingLimit_local;
  word *location_local;
  CapTableReader *capTable_local;
  SegmentReader *segment_local;
  
  f.exception._4_4_ = nestingLimit;
  bVar1 = WireHelpers::boundsCheck(segment,location,1);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xa6c,FAILED,"WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS)",
               "\"Root location out-of-bounds.\"",(char (*) [29])"Root location out-of-bounds.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  PointerReader(__return_storage_ptr__,segment,capTable,(WirePointer *)location,f.exception._4_4_);
  return __return_storage_ptr__;
}

Assistant:

PointerReader PointerReader::getRoot(SegmentReader* segment, CapTableReader* capTable,
                                     const word* location, int nestingLimit) {
  KJ_REQUIRE(WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS),
             "Root location out-of-bounds.") {
    location = nullptr;
  }

  return PointerReader(segment, capTable,
      reinterpret_cast<const WirePointer*>(location), nestingLimit);
}